

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void __thiscall TicSpecial::TicSpecial(TicSpecial *this)

{
  long lVar1;
  void *pvVar2;
  
  this->lastmaketic = -1;
  this->specialsize = 0x100;
  for (lVar1 = 0; lVar1 != 0x24; lVar1 = lVar1 + 1) {
    this->streams[lVar1] = (BYTE *)0x0;
  }
  for (lVar1 = -0x120; lVar1 != 0; lVar1 = lVar1 + 8) {
    pvVar2 = M_Malloc_Dbg(0x100,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_net.cpp"
                          ,0xcd);
    *(void **)((long)this->used + lVar1) = pvVar2;
    *(undefined8 *)((long)&this->streamptr + lVar1) = 0;
  }
  this->okay = true;
  return;
}

Assistant:

TicSpecial ()
	{
		int i;

		lastmaketic = -1;
		specialsize = 256;

		for (i = 0; i < BACKUPTICS; i++)
			streams[i] = NULL;

		for (i = 0; i < BACKUPTICS; i++)
		{
			streams[i] = (BYTE *)M_Malloc (256);
			used[i] = 0;
		}
		okay = true;
	}